

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
* toml::detail::parse_simple_key<toml::type_config>
            (result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
             *__return_storage_ptr__,location *loc,context<toml::type_config> *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  element_type *peVar4;
  ulong uVar5;
  long lVar6;
  value_type *pvVar7;
  error_info *v;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last;
  char *__s;
  ulong uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_01;
  size_type __len2;
  failure<toml::error_info> *__return_storage_ptr___00;
  bool bVar9;
  string postfix;
  result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
  str_res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  string local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_320;
  undefined8 local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  error_info local_300;
  string local_2a8;
  string local_288;
  success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_268;
  success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  repeat_at_least local_228;
  result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
  local_210;
  location local_180;
  failure<toml::error_info> local_138;
  failure<toml::error_info> local_e0;
  failure<toml::error_info> local_88;
  
  peVar4 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  uVar5 = loc->location_;
  last._M_current =
       (peVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_start;
  uVar8 = (long)(peVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)last._M_current;
  if (uVar5 < uVar8) {
    if (last._M_current[uVar5] == '\"') {
      parse_basic_string_only<toml::type_config>(&local_210,loc,ctx);
      if (local_210.is_ok_ == true) {
        pvVar7 = result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
                 ::unwrap(&local_210,(source_location)0x569ed0);
        ok<std::__cxx11::string>(&local_248,(toml *)pvVar7,v_00);
        __return_storage_ptr__->is_ok_ = true;
        paVar1 = &(__return_storage_ptr__->field_1).succ_.value.field_2;
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)&__return_storage_ptr__->field_1 = paVar1;
        paVar3 = &local_248.value.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248.value._M_dataplus._M_p == paVar3) {
          paVar1->_M_allocated_capacity =
               CONCAT71(local_248.value.field_2._M_allocated_capacity._1_7_,
                        local_248.value.field_2._M_local_buf[0]);
          *(undefined8 *)((long)&(__return_storage_ptr__->field_1).succ_.value.field_2 + 8) =
               local_248.value.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->field_1).succ_.value._M_dataplus._M_p =
               local_248.value._M_dataplus._M_p;
          (__return_storage_ptr__->field_1).succ_.value.field_2._M_allocated_capacity =
               CONCAT71(local_248.value.field_2._M_allocated_capacity._1_7_,
                        local_248.value.field_2._M_local_buf[0]);
        }
        (__return_storage_ptr__->field_1).succ_.value._M_string_length =
             local_248.value._M_string_length;
        local_248.value._M_string_length = 0;
        local_248.value.field_2._M_local_buf[0] = '\0';
        local_248.value._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        v = result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
            ::unwrap_err(&local_210,(source_location)0x569ee8);
        __return_storage_ptr___00 = &local_88;
LAB_003bbd11:
        err<toml::error_info>(__return_storage_ptr___00,v);
        __return_storage_ptr__->is_ok_ = false;
        failure<toml::error_info>::failure
                  ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,
                   __return_storage_ptr___00);
        failure<toml::error_info>::~failure(__return_storage_ptr___00);
      }
    }
    else {
      if ((uVar8 <= uVar5) || (last._M_current[uVar5] != '\'')) goto LAB_003bb945;
      parse_literal_string_only<toml::type_config>(&local_210,loc,ctx);
      if (local_210.is_ok_ != true) {
        v = result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
            ::unwrap_err(&local_210,(source_location)0x569f18);
        __return_storage_ptr___00 = &local_e0;
        goto LAB_003bbd11;
      }
      pvVar7 = result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
               ::unwrap(&local_210,(source_location)0x569f00);
      ok<std::__cxx11::string>(&local_268,(toml *)pvVar7,v_01);
      __return_storage_ptr__->is_ok_ = true;
      paVar1 = &(__return_storage_ptr__->field_1).succ_.value.field_2;
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)&__return_storage_ptr__->field_1 = paVar1;
      paVar3 = &local_268.value.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268.value._M_dataplus._M_p == paVar3) {
        paVar1->_M_allocated_capacity =
             CONCAT71(local_268.value.field_2._M_allocated_capacity._1_7_,
                      local_268.value.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&(__return_storage_ptr__->field_1).succ_.value.field_2 + 8) =
             local_268.value.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->field_1).succ_.value._M_dataplus._M_p =
             local_268.value._M_dataplus._M_p;
        (__return_storage_ptr__->field_1).succ_.value.field_2._M_allocated_capacity =
             CONCAT71(local_268.value.field_2._M_allocated_capacity._1_7_,
                      local_268.value.field_2._M_local_buf[0]);
      }
      (__return_storage_ptr__->field_1).succ_.value._M_string_length =
           local_268.value._M_string_length;
      local_268.value._M_string_length = 0;
      local_268.value.field_2._M_local_buf[0] = '\0';
      local_268.value._M_dataplus._M_p = (pointer)paVar3;
    }
    if (local_210.is_ok_ == true) {
      success<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>_>
      ::~success(&local_210.field_1.succ_);
    }
    else {
      failure<toml::error_info>::~failure((failure<toml::error_info> *)&local_210.field_1.succ_);
    }
  }
  else {
LAB_003bb945:
    syntax::unquoted_key((repeat_at_least *)&local_300,&ctx->toml_spec_);
    repeat_at_least::scan((region *)&local_210,(repeat_at_least *)&local_300,loc);
    if ((long *)local_300.title_.field_2._M_allocated_capacity != (long *)0x0) {
      (**(code **)(*(long *)local_300.title_.field_2._M_allocated_capacity + 8))();
    }
    if ((long *)CONCAT71(local_210._1_7_,local_210.is_ok_) == (long *)0x0) {
      local_360._M_string_length = 0;
      local_360.field_2._M_allocated_capacity =
           local_360.field_2._M_allocated_capacity & 0xffffffffffffff00;
      __s = "Hint: non-ASCII scripts are allowed in toml v1.1.0, but not in v1.0.0.\n";
      bVar9 = (ctx->toml_spec_).v1_1_0_allow_non_english_in_bare_keys != false;
      if (bVar9) {
        __s = "Hint: Not all Unicode characters are allowed as bare key.\n";
      }
      __len2 = 0x47;
      if (bVar9) {
        __len2 = 0x3a;
      }
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_replace(&local_360,0,0,__s,__len2);
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_288,
                 "toml::parse_simple_key: invalid key: key must be \"quoted\", \'quoted-literal\', or bare key."
                 ,"");
      syntax::unquoted_key(&local_228,&ctx->toml_spec_);
      location::location(&local_180,loc);
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2a8,local_360._M_dataplus._M_p,
                 local_360._M_dataplus._M_p + local_360._M_string_length);
      make_syntax_error<toml::detail::repeat_at_least>
                (&local_300,&local_288,&local_228,&local_180,&local_2a8);
      err<toml::error_info>(&local_138,&local_300);
      __return_storage_ptr__->is_ok_ = false;
      failure<toml::error_info>::failure
                ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_138);
      failure<toml::error_info>::~failure(&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300.suffix_._M_dataplus._M_p != &local_300.suffix_.field_2) {
        operator_delete(local_300.suffix_._M_dataplus._M_p,
                        local_300.suffix_.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_300.locations_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300.title_._M_dataplus._M_p != &local_300.title_.field_2) {
        operator_delete(local_300.title_._M_dataplus._M_p,
                        local_300.title_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      location::~location(&local_180);
      if (local_228.other_.scanner_._M_t.
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
          (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
           )0x0) {
        (*(*(_func_int ***)
            local_228.other_.scanner_._M_t.
            super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
            ._M_t.
            super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
            .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      lVar6 = *(long *)CONCAT71(local_210._1_7_,local_210.is_ok_);
      make_string<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (&local_340,
                 (detail *)
                 (&((local_210.field_1.fail_.value.locations_.
                     super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).is_ok_ + lVar6),
                 (uchar *)(lVar6 + local_210.field_1._72_8_),last);
      paVar1 = &local_300.title_.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p == &local_340.field_2) {
        local_300.title_.field_2._8_8_ = local_340.field_2._8_8_;
        local_300.title_._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_300.title_._M_dataplus._M_p = local_340._M_dataplus._M_p;
      }
      local_300.title_.field_2._M_allocated_capacity._1_7_ =
           local_340.field_2._M_allocated_capacity._1_7_;
      local_300.title_.field_2._M_local_buf[0] = local_340.field_2._M_local_buf[0];
      paVar2 = &local_360.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300.title_._M_dataplus._M_p == paVar1) {
        local_360.field_2._8_8_ = local_300.title_.field_2._8_8_;
        local_360._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_360._M_dataplus._M_p = local_300.title_._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p == paVar2) {
        local_300.title_.field_2._8_8_ = local_360.field_2._8_8_;
        local_300.title_._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_300.title_._M_dataplus._M_p = local_360._M_dataplus._M_p;
      }
      local_360.field_2._M_allocated_capacity =
           (ulong)(uint7)local_340.field_2._M_allocated_capacity._1_7_ * 0x100;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300.title_._M_dataplus._M_p == paVar1) {
        local_310._8_8_ = local_300.title_.field_2._8_8_;
        local_320 = &local_310;
      }
      else {
        local_320 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_300.title_._M_dataplus._M_p;
      }
      __return_storage_ptr__->is_ok_ = true;
      paVar1 = &(__return_storage_ptr__->field_1).succ_.value.field_2;
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)&__return_storage_ptr__->field_1 = paVar1;
      if (local_320 == &local_310) {
        paVar1->_M_allocated_capacity = local_300.title_.field_2._M_allocated_capacity;
        *(undefined8 *)((long)&(__return_storage_ptr__->field_1).succ_.value.field_2 + 8) =
             local_310._8_8_;
      }
      else {
        (__return_storage_ptr__->field_1).succ_.value._M_dataplus._M_p = (pointer)local_320;
        (__return_storage_ptr__->field_1).succ_.value.field_2._M_allocated_capacity =
             local_300.title_.field_2._M_allocated_capacity;
      }
      (__return_storage_ptr__->field_1).succ_.value._M_string_length = local_340._M_string_length;
      local_310._M_allocated_capacity =
           (ulong)(uint7)local_340.field_2._M_allocated_capacity._1_7_ << 8;
      local_318 = 0;
      local_340.field_2._M_local_buf[0] = '\0';
      local_340._M_string_length = 0;
      local_360._M_string_length = 0;
      local_360._M_dataplus._M_p = (pointer)paVar2;
      local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
      local_320 = &local_310;
    }
    region::~region((region *)&local_210);
  }
  return __return_storage_ptr__;
}

Assistant:

result<typename basic_value<TC>::key_type, error_info>
parse_simple_key(location& loc, const context<TC>& ctx)
{
    using key_type = typename basic_value<TC>::key_type;
    const auto& spec = ctx.toml_spec();

    if(loc.current() == '\"')
    {
        auto str_res = parse_basic_string_only(loc, ctx);
        if(str_res.is_ok())
        {
            return ok(std::move(str_res.unwrap().first));
        }
        else
        {
            return err(std::move(str_res.unwrap_err()));
        }
    }
    else if(loc.current() == '\'')
    {
        auto str_res = parse_literal_string_only(loc, ctx);
        if(str_res.is_ok())
        {
            return ok(std::move(str_res.unwrap().first));
        }
        else
        {
            return err(std::move(str_res.unwrap_err()));
        }
    }

    // bare key.

    if(const auto bare = syntax::unquoted_key(spec).scan(loc))
    {
        return ok(string_conv<key_type>(bare.as_string()));
    }
    else
    {
        std::string postfix;
        if(spec.v1_1_0_allow_non_english_in_bare_keys)
        {
            postfix = "Hint: Not all Unicode characters are allowed as bare key.\n";
        }
        else
        {
            postfix = "Hint: non-ASCII scripts are allowed in toml v1.1.0, but not in v1.0.0.\n";
        }
        return err(make_syntax_error("toml::parse_simple_key: "
            "invalid key: key must be \"quoted\", 'quoted-literal', or bare key.",
            syntax::unquoted_key(spec), loc, postfix));
    }
}